

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  int iVar1;
  TimeInMillis local_68;
  String local_60;
  void *local_50 [2];
  string local_40;
  
  iVar1 = TestCase::failed_test_count(test_case);
  local_68 = test_case->elapsed_time_;
  StreamableToString<long_long>((internal *)local_50,&local_68);
  String::Format(&local_60,"event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",(ulong)(iVar1 < 1),
                 local_50[0]);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,local_60.c_str_,local_60.c_str_ + local_60.length_);
  Send(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60.c_str_ != (char *)0x0) {
    operator_delete__(local_60.c_str_);
  }
  if (local_50[0] != (void *)0x0) {
    operator_delete__(local_50[0]);
  }
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    Send(String::Format("event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                        test_case.Passed(),
                        StreamableToString(test_case.elapsed_time()).c_str()));
  }